

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O3

double Cudd_ReadUsedSlots(DdManager *dd)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  
  if ((long)dd->size < 1) {
    lVar1 = 0;
  }
  else {
    lVar3 = 0;
    lVar1 = 0;
    do {
      uVar2 = (ulong)dd->subtables[lVar3].slots;
      if (uVar2 != 0) {
        uVar4 = 0;
        do {
          lVar1 = lVar1 + (ulong)((DdManager *)dd->subtables[lVar3].nodelist[uVar4] != dd);
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != dd->size);
  }
  if (0 < (long)dd->sizeZ) {
    lVar3 = 0;
    do {
      uVar2 = (ulong)dd->subtableZ[lVar3].slots;
      if (uVar2 != 0) {
        uVar4 = 0;
        do {
          lVar1 = (lVar1 + 1) - (ulong)(dd->subtableZ[lVar3].nodelist[uVar4] == (DdNode *)0x0);
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != dd->sizeZ);
  }
  uVar2 = (ulong)(dd->constants).slots;
  if (uVar2 != 0) {
    uVar4 = 0;
    do {
      lVar1 = (lVar1 + 1) - (ulong)((dd->constants).nodelist[uVar4] == (DdNode *)0x0);
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar5._0_8_ = lVar1;
  auVar5._12_4_ = 0x45300000;
  return ((auVar5._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / (double)dd->slots;
}

Assistant:

double
Cudd_ReadUsedSlots(
  DdManager * dd)
{
    unsigned long used = 0;
    int i, j;
    int size = dd->size;
    DdNodePtr *nodelist;
    DdSubtable *subtable;
    DdNode *node;
    DdNode *sentinel = &(dd->sentinel);

    /* Scan each BDD/ADD subtable. */
    for (i = 0; i < size; i++) {
        subtable = &(dd->subtables[i]);
        nodelist = subtable->nodelist;
        for (j = 0; (unsigned) j < subtable->slots; j++) {
            node = nodelist[j];
            if (node != sentinel) {
                used++;
            }
        }
    }

    /* Scan the ZDD subtables. */
    size = dd->sizeZ;

    for (i = 0; i < size; i++) {
        subtable = &(dd->subtableZ[i]);
        nodelist = subtable->nodelist;
        for (j = 0; (unsigned) j < subtable->slots; j++) {
            node = nodelist[j];
            if (node != NULL) {
                used++;
            }
        }
    }

    /* Constant table. */
    subtable = &(dd->constants);
    nodelist = subtable->nodelist;
    for (j = 0; (unsigned) j < subtable->slots; j++) {
        node = nodelist[j];
        if (node != NULL) {
            used++;
        }
    }

    return((double)used / (double) dd->slots);

}